

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParsingOptions.cpp
# Opt level: O1

PDFParsingOptions * PDFParsingOptions::DefaultPDFParsingOptions(void)

{
  int iVar1;
  string local_30;
  
  if (DefaultPDFParsingOptions()::pdf_parsing_options == '\0') {
    iVar1 = __cxa_guard_acquire(&DefaultPDFParsingOptions()::pdf_parsing_options);
    if (iVar1 != 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"");
      PDFParsingOptions(&DefaultPDFParsingOptions::pdf_parsing_options,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(~PDFParsingOptions,&DefaultPDFParsingOptions::pdf_parsing_options,&__dso_handle);
      __cxa_guard_release(&DefaultPDFParsingOptions()::pdf_parsing_options);
    }
  }
  return &DefaultPDFParsingOptions::pdf_parsing_options;
}

Assistant:

const PDFParsingOptions& PDFParsingOptions::DefaultPDFParsingOptions(){
	static PDFParsingOptions pdf_parsing_options("");
	return pdf_parsing_options;
}